

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_reader.cpp
# Opt level: O2

void __thiscall
duckdb::MetadataReader::MetadataReader
          (MetadataReader *this,MetadataManager *manager,BlockPointer pointer)

{
  idx_t iVar1;
  ulong uVar2;
  ulong uVar3;
  MetaBlockPointer pointer_00;
  
  iVar1 = MetadataManager::GetMetadataBlockSize(manager);
  if (pointer.block_id == 0xffffffffffffffff) {
    uVar3 = 0xffffffffffffffff;
    uVar2 = 0;
  }
  else {
    uVar3 = pointer._8_8_ & 0xffffffff;
    uVar2 = uVar3 % iVar1;
    uVar3 = uVar3 / iVar1 << 0x38 | pointer.block_id;
  }
  pointer_00.offset = (int)uVar2;
  pointer_00.unused_padding = (int)(uVar2 >> 0x20);
  pointer_00.block_pointer = uVar3;
  MetadataReader(this,manager,pointer_00,
                 (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,
                 EXISTING_BLOCKS);
  return;
}

Assistant:

MetadataReader::MetadataReader(MetadataManager &manager, BlockPointer pointer)
    : MetadataReader(manager, MetadataManager::FromBlockPointer(pointer, manager.GetMetadataBlockSize())) {
}